

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

_Bool array_container_intersect(array_container_t *array1,array_container_t *array2)

{
  int iVar1;
  int iVar2;
  _Bool _Var3;
  int *in_RSI;
  int *in_RDI;
  int threshold;
  size_t unaff_retaddr;
  int32_t card_2;
  int32_t card_1;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  iVar1 = *in_RDI;
  iVar2 = *in_RSI;
  if (iVar1 * 0x40 < iVar2) {
    _Var3 = intersect_skewed_uint16_nonempty
                      (_card_2,unaff_retaddr,
                       (uint16_t *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (size_t)in_RDI);
  }
  else if (iVar2 * 0x40 < iVar1) {
    _Var3 = intersect_skewed_uint16_nonempty
                      (_card_2,unaff_retaddr,
                       (uint16_t *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (size_t)in_RDI);
  }
  else {
    _Var3 = intersect_uint16_nonempty
                      (*(uint16_t **)(in_RDI + 2),(long)iVar1,*(uint16_t **)(in_RSI + 2),(long)iVar2
                      );
  }
  return _Var3;
}

Assistant:

bool array_container_intersect(const array_container_t *array1,
                               const array_container_t *array2) {
    int32_t card_1 = array1->cardinality, card_2 = array2->cardinality;
    const int threshold = 64;  // subject to tuning
    if (card_1 * threshold < card_2) {
        return intersect_skewed_uint16_nonempty(array1->array, card_1,
                                                array2->array, card_2);
    } else if (card_2 * threshold < card_1) {
        return intersect_skewed_uint16_nonempty(array2->array, card_2,
                                                array1->array, card_1);
    } else {
        // we do not bother vectorizing
        return intersect_uint16_nonempty(array1->array, card_1, array2->array,
                                         card_2);
    }
}